

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsets.cpp
# Opt level: O2

void __thiscall icu_63::TailoredSet::add(TailoredSet *this,UChar32 c)

{
  UnicodeString s;
  UnicodeString UStack_58;
  
  if (((ushort)(this->unreversedPrefix).fUnion.fStackFields.fLengthAndFlags < 0x20) &&
     (this->suffix == (UnicodeString *)0x0)) {
    UnicodeSet::add(this->tailored,c);
    return;
  }
  UnicodeString::UnicodeString(&UStack_58,&this->unreversedPrefix);
  UnicodeString::append(&UStack_58,c);
  if (this->suffix != (UnicodeString *)0x0) {
    UnicodeString::append(&UStack_58,this->suffix);
  }
  UnicodeSet::add(this->tailored,&UStack_58);
  UnicodeString::~UnicodeString(&UStack_58);
  return;
}

Assistant:

void
TailoredSet::add(UChar32 c) {
    if(unreversedPrefix.isEmpty() && suffix == NULL) {
        tailored->add(c);
    } else {
        UnicodeString s(unreversedPrefix);
        s.append(c);
        if(suffix != NULL) {
            s.append(*suffix);
        }
        tailored->add(s);
    }
}